

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

Time __thiscall helics::FederateState::getTimeProperty(FederateState *this,int timeProperty)

{
  Time TVar1;
  
  if (timeProperty != 0x8f) {
    if (timeProperty == 0x90) {
      return (Time)(this->rt_lead).internalTimeCode;
    }
    if (timeProperty == 0xa1) {
      return (Time)(this->grantTimeOutPeriod).internalTimeCode;
    }
    if (timeProperty != 0x91) {
      TVar1 = TimeCoordinator::getTimeProperty
                        ((this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                         timeProperty);
      return (Time)TVar1.internalTimeCode;
    }
  }
  return (Time)(this->rt_lag).internalTimeCode;
}

Assistant:

Time FederateState::getTimeProperty(int timeProperty) const
{
    switch (timeProperty) {
        case defs::Properties::RT_LAG:
        case defs::Properties::RT_TOLERANCE:
            return rt_lag;
        case defs::Properties::RT_LEAD:
            return rt_lead;
        case defs::Properties::GRANT_TIMEOUT:
            return grantTimeOutPeriod;
        default:
            return timeCoord->getTimeProperty(timeProperty);
    }
}